

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

shared_ptr<f8n::prefs::Preferences> __thiscall
f8n::prefs::Preferences::ForComponent(Preferences *this,string *c,Mode mode)

{
  int *piVar1;
  pointer pcVar2;
  long *plVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  int iVar5;
  char *__s;
  iterator iVar6;
  Preferences *this_01;
  mapped_type *pmVar7;
  _func_int **pp_Var8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong __maxlen;
  bool bVar9;
  shared_ptr<f8n::prefs::Preferences> sVar10;
  string key;
  unique_lock<std::mutex> lock;
  long *local_80 [2];
  long local_70 [2];
  key_type local_60;
  unique_lock<std::mutex> local_40;
  
  local_40._M_device = &cacheMutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"%s-%d","");
  pcVar2 = (c->_M_dataplus)._M_p;
  iVar5 = snprintf((char *)0x0,0,(char *)local_80[0],pcVar2,(ulong)mode);
  __maxlen = (ulong)(iVar5 + 1);
  __s = (char *)operator_new__(__maxlen);
  snprintf(__s,__maxlen,(char *)local_80[0],pcVar2,(ulong)mode);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,__s,__s + (__maxlen - 1));
  operator_delete__(__s);
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&componentCache_abi_cxx11_._M_h,&local_60);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    pp_Var8 = *(_func_int ***)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_true>
                      ._M_cur + 0x28);
    plVar3 = *(long **)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_true>
                              ._M_cur + 0x30);
    if (plVar3 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)plVar3 + 0xc) = *(int *)((long)plVar3 + 0xc) + 1;
      }
    }
    (this->mutex).super___mutex_base._M_mutex.__align = (long)plVar3;
    if (plVar3 != (long *)0x0) {
      iVar5 = (int)plVar3[1];
      do {
        if (iVar5 == 0) {
          (this->mutex).super___mutex_base._M_mutex.__align = 0;
          break;
        }
        LOCK();
        iVar4 = (int)plVar3[1];
        bVar9 = iVar5 == iVar4;
        if (bVar9) {
          *(int *)(plVar3 + 1) = iVar5 + 1;
          iVar4 = iVar5;
        }
        iVar5 = iVar4;
        UNLOCK();
      } while (!bVar9);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->mutex).super___mutex_base._M_mutex.__align;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var8 = (_func_int **)0x0;
    }
    else if (this_00->_M_use_count == 0) {
      pp_Var8 = (_func_int **)0x0;
    }
    (this->super_IPreferences)._vptr_IPreferences = pp_Var8;
    if (pp_Var8 != (_func_int **)0x0) {
      if (plVar3 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)plVar3 + 0xc);
          iVar5 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = *(int *)((long)plVar3 + 0xc);
          *(int *)((long)plVar3 + 0xc) = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (**(code **)(*plVar3 + 0x18))(plVar3);
        }
      }
      goto LAB_001d4292;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (plVar3 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar3 + 0xc);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)plVar3 + 0xc);
        *(int *)((long)plVar3 + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (**(code **)(*plVar3 + 0x18))(plVar3);
      }
    }
  }
  this_01 = (Preferences *)operator_new(0x68);
  Preferences(this_01,c,mode);
  (this->super_IPreferences)._vptr_IPreferences = (_func_int **)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<f8n::prefs::Preferences*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->mutex,this_01);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<f8n::prefs::Preferences>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&componentCache_abi_cxx11_,&local_60);
  (pmVar7->super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(this->super_IPreferences)._vptr_IPreferences;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar7->super___weak_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->mutex);
LAB_001d4292:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  sVar10.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar10.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<f8n::prefs::Preferences>)
         sVar10.super___shared_ptr<f8n::prefs::Preferences,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Preferences> Preferences::ForComponent(
    const std::string& c, Preferences::Mode mode)
{
    std::unique_lock<std::mutex> lock(cacheMutex);

    std::string key = CACHE_KEY(c, mode);

    auto it = componentCache.find(key);
    if (it != componentCache.end()) {
        auto weak = it->second;
        try {
            auto shared = weak.lock();
            if (shared) {
                return shared;
            }
        }
        catch (...) {
            /* unable to lock, let's create a new one... */
        }
    }

    std::shared_ptr<Preferences> prefs(new Preferences(c, mode));
    componentCache[key] = prefs;
    return prefs;
}